

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O2

void __thiscall spdlog::async_logger::flush_(async_logger *this)

{
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  async_logger_ptr local_50;
  __shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> local_40;
  string local_30;
  
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&this->thread_pool_);
  if (local_40._M_ptr == (thread_pool *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_30,"async flush: thread pool doesn\'t exist anymore",
               (allocator *)&local_50);
    throw_spdlog_ex(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<spdlog::async_logger,void>
              ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<spdlog::async_logger>);
    details::thread_pool::post_flush(local_40._M_ptr,&local_50,this->overflow_policy_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::flush_()
{
    if (auto pool_ptr = thread_pool_.lock())
    {
        pool_ptr->post_flush(shared_from_this(), overflow_policy_);
    }
    else
    {
        throw_spdlog_ex("async flush: thread pool doesn't exist anymore");
    }
}